

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall
ninx::parser::Parser::parse_sub_expression
          (Parser *this,
          function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
          *term_parser,
          vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
          *operators)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference sequence;
  ulong uVar4;
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  *in_RCX;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_90;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_88;
  undefined1 local_80 [8];
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  sub_expr;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  second;
  int i;
  OperatorCaseDefinition *case_def;
  iterator __end2;
  iterator __begin2;
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  *__range2;
  bool found;
  undefined1 local_38 [8];
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  first;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  expression;
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  *operators_local;
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  *term_parser_local;
  Parser *this_local;
  
  std::
  unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
  ::unique_ptr<std::default_delete<ninx::parser::element::Expression>,void>
            ((unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
              *)&first,(nullptr_t)0x0);
  std::
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  ::operator()((function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
                *)local_38);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::operator=(&first,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                      *)local_38);
  do {
    bVar1 = false;
    __end2 = std::
             vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
             ::begin(in_RCX);
    case_def = (OperatorCaseDefinition *)
               std::
               vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
               ::end(in_RCX);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<ninx::parser::OperatorCaseDefinition_*,_std::vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>_>
                                  *)&case_def);
      if (!bVar2) goto LAB_0014e027;
      sequence = __gnu_cxx::
                 __normal_iterator<ninx::parser::OperatorCaseDefinition_*,_std::vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>_>
                 ::operator*(&__end2);
      iVar3 = TokenReader::check_limiter_sequence((TokenReader *)(term_parser + 1),&sequence->op);
      if (iVar3 == 1) break;
      __gnu_cxx::
      __normal_iterator<ninx::parser::OperatorCaseDefinition_*,_std::vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>_>
      ::operator++(&__end2);
    }
    for (second._M_t.
         super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
         ._M_t.
         super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
         .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl._4_4_ = 0;
        uVar4 = std::__cxx11::string::length(),
        (ulong)(long)second._M_t.
                     super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
                     .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl
                     ._4_4_ < uVar4;
        second._M_t.
        super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
        .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl._4_4_ =
             second._M_t.
             super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
             .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl._4_4_ +
             1) {
      TokenReader::get_token((TokenReader *)(term_parser + 1));
    }
    std::
    function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
    ::operator()((function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
                  *)&sub_expr);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::unique_ptr(&local_88,&first);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::unique_ptr(&local_90,&sub_expr);
    std::
    function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>,_std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>)>
    ::operator()((function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>,_std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>)>
                  *)local_80,
                 (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                  *)&sequence->builder,&local_88);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::~unique_ptr(&local_90);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::~unique_ptr(&local_88);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::operator=(&first,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                        *)local_80);
    bVar1 = true;
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                   *)local_80);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::~unique_ptr(&sub_expr);
LAB_0014e027:
    if (!bVar1) {
      std::
      unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
      ::unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                    *)this,&first);
      std::
      unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                     *)local_38);
      std::
      unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
      ::~unique_ptr(&first);
      return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
              )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
                )this;
    }
  } while( true );
}

Assistant:

std::unique_ptr<Expression>
ninx::parser::Parser::parse_sub_expression(std::function<std::unique_ptr<Expression>()> term_parser,
                                           std::vector<ninx::parser::OperatorCaseDefinition> operators) {
    std::unique_ptr<Expression> expression{nullptr};

    auto first{term_parser()};
    expression = std::move(first);

    while (true) {
        bool found{false};

        for (auto &case_def : operators) {
            if (reader.check_limiter_sequence(case_def.op) == 1) {
                // Remove the tokens
                for (int i = 0; i<case_def.op.length(); i++) {
                    reader.get_token();
                }

                auto second{term_parser()};

                auto sub_expr = case_def.builder(std::move(expression), std::move(second));
                expression = std::move(sub_expr);

                found = true;
                break;
            }
        }

        if (!found) {
            break;
        }
    }

    return std::move(expression);
}